

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O0

int bsp_find_closest_points(void *handle,float *point,float radius,int **pointarray)

{
  int iVar1;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  float fVar2;
  float diff;
  float bestradius;
  int closest;
  int cnt;
  int i;
  int d;
  bsp_tree *tree;
  int **in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc4;
  float fVar3;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar6;
  float local_14;
  
  bsp_find_points((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  (float *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  iVar1 = array_count((void *)*in_RDX);
  iVar4 = -1;
  fVar3 = 3.4028235e+38;
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    local_14 = 0.0;
    for (iVar6 = 0; iVar6 < (int)(uint)*(byte *)(in_RDI + 1); iVar6 = iVar6 + 1) {
      fVar2 = *(float *)(in_RSI + (long)iVar6 * 4) -
              *(float *)(*(long *)(*in_RDI + (long)iVar6 * 8) +
                        (long)*(int *)(*in_RDX + (long)iVar5 * 4) * 4);
      local_14 = fVar2 * fVar2 + local_14;
    }
    if (local_14 < fVar3) {
      iVar4 = *(int *)(*in_RDX + (long)iVar5 * 4);
      fVar3 = local_14;
    }
  }
  return iVar4;
}

Assistant:

int
bsp_find_closest_points(
    void * handle,
    float * point,
    float radius,
    int ** pointarray )
{
    bsp_tree * tree;
    int d, i, cnt, closest;
    float bestradius;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );

    bsp_find_points( tree, point, radius, pointarray );

    cnt = array_count( pointarray[0] );
    closest = -1;
    bestradius = FLT_MAX;
    for ( i = 0; i < cnt; i++ ) {
        radius = 0.0f;
        for ( d = 0; d < tree->dimensions; d++ ) {
            float diff;
            diff = point[d] - tree->pointarrays[d][pointarray[0][i]];
            radius += diff * diff;
        }
        if ( radius < bestradius ) {
            closest = pointarray[0][i];
            bestradius = radius;
        }
    }

    return closest;
}